

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O1

void __thiscall
SRCTools::ResamplerModel::CascadeStage::getOutputSamples
          (CascadeStage *this,FloatSample *outBuffer,uint length)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint local_3c;
  FloatSample *local_38;
  
  if (length != 0) {
    puVar1 = &this->size;
    local_3c = length;
    local_38 = outBuffer;
    do {
      if (*puVar1 == 0) {
        uVar2 = (*this->resamplerStage->_vptr_ResamplerStage[2])(this->resamplerStage,local_3c);
        this->size = uVar2;
        if (uVar2 == 0) {
          uVar3 = 1;
LAB_0011f3bf:
          *puVar1 = uVar3;
        }
        else {
          uVar3 = 0x1000;
          if (0x1000 < uVar2) goto LAB_0011f3bf;
        }
        (*this->source->_vptr_FloatSampleProvider[2])(this->source,this->buffer,(ulong)this->size);
        this->bufferPtr = this->buffer;
      }
      (*this->resamplerStage->_vptr_ResamplerStage[3])
                (this->resamplerStage,&this->bufferPtr,puVar1,&local_38,&local_3c);
    } while (local_3c != 0);
  }
  return;
}

Assistant:

void CascadeStage::getOutputSamples(FloatSample *outBuffer, unsigned int length) {
	while (length > 0) {
		if (size == 0) {
			size = resamplerStage.estimateInLength(length);
			if (size < 1) {
				size = 1;
			} else if (MAX_SAMPLES_PER_RUN < size) {
				size = MAX_SAMPLES_PER_RUN;
			}
			source.getOutputSamples(buffer, size);
			bufferPtr = buffer;
		}
		resamplerStage.process(bufferPtr, size, outBuffer, length);
	}
}